

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O0

string * ApprovalTests::FileUtils::readFileReturnEmptyIfMissing(string *fileName)

{
  bool bVar1;
  string *in_RDI;
  string *in_stack_00000060;
  string *in_stack_000003c8;
  
  bVar1 = fileExists(in_stack_00000060);
  if (bVar1) {
    readFileThrowIfMissing(in_stack_000003c8);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string FileUtils::readFileReturnEmptyIfMissing(const std::string& fileName)
    {
        if (FileUtils::fileExists(fileName))
        {
            return readFileThrowIfMissing(fileName);
        }
        else
        {
            return std::string();
        }
    }